

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.h
# Opt level: O1

minutes __thiscall absl::lts_20250127::ToChronoMinutes(lts_20250127 *this,Duration d)

{
  minutes mVar1;
  
  if (d.rep_hi_.lo_ != 0xffffffff) {
    return (minutes)((long)(this + (d.rep_hi_.lo_ != 0 && (long)this < 0)) / 0x3c);
  }
  mVar1.__r = -0x8000000000000000;
  if (-1 < (long)this) {
    mVar1.__r = 0x7fffffffffffffff;
  }
  return (minutes)mVar1.__r;
}

Assistant:

ABSL_ATTRIBUTE_CONST_FUNCTION constexpr bool IsInfiniteDuration(Duration d) {
  return GetRepLo(d) == ~uint32_t{0};
}